

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O2

btBroadphasePair * __thiscall
btHashedOverlappingPairCache::internalAddPair
          (btHashedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  uint proxyId1;
  uint proxyId2;
  int iVar1;
  int iVar2;
  btOverlappingPairCallback *pbVar3;
  int *piVar4;
  uint uVar5;
  btBroadphasePair *pbVar6;
  btBroadphaseProxy *proxy1_00;
  btBroadphaseProxy *pbVar7;
  
  proxy1_00 = proxy1;
  if (proxy1->m_uniqueId < proxy0->m_uniqueId) {
    proxy1_00 = proxy0;
    proxy0 = proxy1;
  }
  proxyId1 = proxy0->m_uniqueId;
  proxyId2 = proxy1_00->m_uniqueId;
  uVar5 = getHash(this,proxyId1,proxyId2);
  uVar5 = (this->m_overlappingPairArray).m_capacity - 1U & uVar5;
  pbVar6 = internalFindPair(this,proxy0,proxy1_00,uVar5);
  if (pbVar6 == (btBroadphasePair *)0x0) {
    iVar1 = (this->m_overlappingPairArray).m_size;
    iVar2 = (this->m_overlappingPairArray).m_capacity;
    pbVar6 = btAlignedObjectArray<btBroadphasePair>::expandNonInitializing
                       (&this->m_overlappingPairArray);
    pbVar3 = this->m_ghostPairCallback;
    if (pbVar3 != (btOverlappingPairCallback *)0x0) {
      (*pbVar3->_vptr_btOverlappingPairCallback[2])(pbVar3,proxy0,proxy1_00);
    }
    if (iVar2 < (this->m_overlappingPairArray).m_capacity) {
      growTables(this);
      uVar5 = getHash(this,proxyId1,proxyId2);
      uVar5 = (this->m_overlappingPairArray).m_capacity - 1U & uVar5;
    }
    pbVar7 = proxy0;
    if (proxy0->m_uniqueId < proxy1_00->m_uniqueId) {
      pbVar7 = proxy1_00;
      proxy1_00 = proxy0;
    }
    pbVar6->m_pProxy0 = proxy1_00;
    pbVar6->m_pProxy1 = pbVar7;
    pbVar6->m_algorithm = (btCollisionAlgorithm *)0x0;
    (pbVar6->field_3).m_internalInfo1 = (void *)0x0;
    piVar4 = (this->m_hashTable).m_data;
    (this->m_next).m_data[iVar1] = piVar4[(int)uVar5];
    piVar4[(int)uVar5] = iVar1;
  }
  return pbVar6;
}

Assistant:

btBroadphasePair* btHashedOverlappingPairCache::internalAddPair(btBroadphaseProxy* proxy0, btBroadphaseProxy* proxy1)
{
	if(proxy0->m_uniqueId>proxy1->m_uniqueId) 
		btSwap(proxy0,proxy1);
	int proxyId1 = proxy0->getUid();
	int proxyId2 = proxy1->getUid();

	/*if (proxyId1 > proxyId2) 
		btSwap(proxyId1, proxyId2);*/

	int	hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1),static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity()-1));	// New hash value with new mask


	btBroadphasePair* pair = internalFindPair(proxy0, proxy1, hash);
	if (pair != NULL)
	{
		return pair;
	}
	/*for(int i=0;i<m_overlappingPairArray.size();++i)
		{
		if(	(m_overlappingPairArray[i].m_pProxy0==proxy0)&&
			(m_overlappingPairArray[i].m_pProxy1==proxy1))
			{
			printf("Adding duplicated %u<>%u\r\n",proxyId1,proxyId2);
			internalFindPair(proxy0, proxy1, hash);
			}
		}*/
	int count = m_overlappingPairArray.size();
	int oldCapacity = m_overlappingPairArray.capacity();
	void* mem = &m_overlappingPairArray.expandNonInitializing();

	//this is where we add an actual pair, so also call the 'ghost'
	if (m_ghostPairCallback)
		m_ghostPairCallback->addOverlappingPair(proxy0,proxy1);

	int newCapacity = m_overlappingPairArray.capacity();

	if (oldCapacity < newCapacity)
	{
		growTables();
		//hash with new capacity
		hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1),static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity()-1));
	}
	
	pair = new (mem) btBroadphasePair(*proxy0,*proxy1);
//	pair->m_pProxy0 = proxy0;
//	pair->m_pProxy1 = proxy1;
	pair->m_algorithm = 0;
	pair->m_internalTmpValue = 0;
	

	m_next[count] = m_hashTable[hash];
	m_hashTable[hash] = count;

	return pair;
}